

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_program.c
# Opt level: O0

ssize_t child_read(archive_read_filter *self,char *buf,size_t buf_len)

{
  int iVar1;
  size_t min;
  int *piVar2;
  ssize_t sVar3;
  program_filter *in_RDX;
  void *in_RSI;
  long in_RDI;
  bool bVar4;
  char *p;
  ssize_t avail;
  ssize_t requested;
  ssize_t ret;
  program_filter *state;
  archive_read_filter *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  program_filter *avail_00;
  archive_read_filter *filter;
  
  filter = *(archive_read_filter **)(in_RDI + 0x50);
  avail_00 = in_RDX;
  if ((program_filter *)0x7fffffffffffffff < in_RDX) {
    in_RDX = (program_filter *)0x7fffffffffffffff;
    avail_00 = in_RDX;
  }
  while( true ) {
    do {
      min = read(*(int *)&filter->read,in_RSI,(size_t)avail_00);
      bVar4 = false;
      if (min == 0xffffffffffffffff) {
        piVar2 = __errno_location();
        bVar4 = *piVar2 == 4;
      }
    } while (bVar4);
    if (0 < (long)min) break;
    if ((min == 0) ||
       ((min == 0xffffffffffffffff && (piVar2 = __errno_location(), *piVar2 == 0x20)))) {
      iVar1 = child_stop(in_stack_ffffffffffffffb8,in_RDX);
      return (long)iVar1;
    }
    if ((min == 0xffffffffffffffff) && (piVar2 = __errno_location(), *piVar2 != 0xb)) {
      return -1;
    }
    if (*(int *)((long)&filter->open + 4) == -1) {
      __archive_check_child(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
    }
    else {
      in_stack_ffffffffffffffb8 =
           (archive_read_filter *)__archive_read_filter_ahead(filter,min,(ssize_t *)avail_00);
      if (in_stack_ffffffffffffffb8 == (archive_read_filter *)0x0) {
        close(*(int *)((long)&filter->open + 4));
        *(undefined4 *)((long)&filter->open + 4) = 0xffffffff;
        fcntl(*(int *)&filter->read,4,0);
        if (in_stack_ffffffffffffffc4 < 0) {
          return CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
        }
      }
      else {
        do {
          sVar3 = write(*(int *)((long)&filter->open + 4),in_stack_ffffffffffffffb8,
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
          bVar4 = false;
          if (sVar3 == -1) {
            piVar2 = __errno_location();
            bVar4 = *piVar2 == 4;
          }
        } while (bVar4);
        if (sVar3 < 1) {
          if ((sVar3 == -1) && (piVar2 = __errno_location(), *piVar2 == 0xb)) {
            __archive_check_child(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
          }
          else {
            close(*(int *)((long)&filter->open + 4));
            *(undefined4 *)((long)&filter->open + 4) = 0xffffffff;
            fcntl(*(int *)&filter->read,4,0);
            if ((sVar3 == -1) && (piVar2 = __errno_location(), *piVar2 != 0x20)) {
              return -1;
            }
          }
        }
        else {
          __archive_read_filter_consume(in_stack_ffffffffffffffb8,(int64_t)in_RDX);
        }
      }
    }
  }
  return min;
}

Assistant:

static ssize_t
child_read(struct archive_read_filter *self, char *buf, size_t buf_len)
{
	struct program_filter *state = self->data;
	ssize_t ret, requested, avail;
	const char *p;
#if defined(_WIN32) && !defined(__CYGWIN__)
	HANDLE handle = (HANDLE)_get_osfhandle(state->child_stdout);
#endif

	requested = buf_len > SSIZE_MAX ? SSIZE_MAX : buf_len;

	for (;;) {
		do {
#if defined(_WIN32) && !defined(__CYGWIN__)
			/* Avoid infinity wait.
			 * Note: If there is no data in the pipe, ReadFile()
			 * called in read() never returns and so we won't
			 * write remaining encoded data to the pipe.
			 * Note: This way may cause performance problem.
			 * we are looking forward to great code to resolve
			 * this.  */
			DWORD pipe_avail = -1;
			int cnt = 2;

			while (PeekNamedPipe(handle, NULL, 0, NULL,
			    &pipe_avail, NULL) != 0 && pipe_avail == 0 &&
			    cnt--)
				Sleep(5);
			if (pipe_avail == 0) {
				ret = -1;
				errno = EAGAIN;
				break;
			}
#endif
			ret = read(state->child_stdout, buf, requested);
		} while (ret == -1 && errno == EINTR);

		if (ret > 0)
			return (ret);
		if (ret == 0 || (ret == -1 && errno == EPIPE))
			/* Child has closed its output; reap the child
			 * and return the status. */
			return (child_stop(self, state));
		if (ret == -1 && errno != EAGAIN)
			return (-1);

		if (state->child_stdin == -1) {
			/* Block until child has some I/O ready. */
			__archive_check_child(state->child_stdin,
			    state->child_stdout);
			continue;
		}

		/* Get some more data from upstream. */
		p = __archive_read_filter_ahead(self->upstream, 1, &avail);
		if (p == NULL) {
			close(state->child_stdin);
			state->child_stdin = -1;
			fcntl(state->child_stdout, F_SETFL, 0);
			if (avail < 0)
				return (avail);
			continue;
		}

		do {
			ret = write(state->child_stdin, p, avail);
		} while (ret == -1 && errno == EINTR);

		if (ret > 0) {
			/* Consume whatever we managed to write. */
			__archive_read_filter_consume(self->upstream, ret);
		} else if (ret == -1 && errno == EAGAIN) {
			/* Block until child has some I/O ready. */
			__archive_check_child(state->child_stdin,
			    state->child_stdout);
		} else {
			/* Write failed. */
			close(state->child_stdin);
			state->child_stdin = -1;
			fcntl(state->child_stdout, F_SETFL, 0);
			/* If it was a bad error, we're done; otherwise
			 * it was EPIPE or EOF, and we can still read
			 * from the child. */
			if (ret == -1 && errno != EPIPE)
				return (-1);
		}
	}
}